

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2test.c
# Opt level: O0

int scan_modifiers(uint8_t *p,uint len)

{
  uint uVar1;
  uint uVar2;
  size_t sVar3;
  uint local_44;
  int local_30;
  int c;
  uint mlen;
  int mid;
  int top;
  int bot;
  uint len_local;
  uint8_t *p_local;
  
  mid = 0;
  mlen = 0x4c;
  uVar1 = mlen;
  do {
    mlen = uVar1;
    if ((int)mlen <= mid) {
      return -1;
    }
    uVar1 = (int)(mid + mlen) / 2;
    sVar3 = strlen(modlist[(int)uVar1].name);
    uVar2 = (uint)sVar3;
    local_44 = uVar2;
    if (len < uVar2) {
      local_44 = len;
    }
    local_30 = strncmp((char *)p,modlist[(int)uVar1].name,(ulong)local_44);
    if (local_30 == 0) {
      if (len == uVar2) {
        return uVar1;
      }
      local_30 = len - uVar2;
    }
    if (0 < local_30) {
      mid = uVar1 + 1;
      uVar1 = mlen;
    }
  } while( true );
}

Assistant:

static int
scan_modifiers(const uint8_t *p, unsigned int len)
{
int bot = 0;
int top = MODLISTCOUNT;

while (top > bot)
  {
  int mid = (bot + top)/2;
  unsigned int mlen = strlen(modlist[mid].name);
  int c = strncmp((char *)p, modlist[mid].name, (len < mlen)? len : mlen);
  if (c == 0)
    {
    if (len == mlen) return mid;
    c = len - mlen;
    }
  if (c > 0) bot = mid + 1; else top = mid;
  }

return -1;

}